

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer-crit.cpp
# Opt level: O2

bool instMatchesCrit(Instruction *I,string *fun,uint line,string *obj,LLVMPointerAnalysis *pta)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  raw_ostream *prVar7;
  bool bVar8;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar9;
  string objname;
  StringRef local_50 [2];
  
  if (fun->_M_string_length != 0) {
    local_50[0] = (StringRef)llvm::Value::getName();
    llvm::StringRef::str_abi_cxx11_(&objname,local_50);
    bVar3 = std::operator!=(&objname,fun);
    std::__cxx11::string::_M_dispose();
    if (bVar3) {
      return false;
    }
  }
  if (line != 0) {
    if (*(long *)(I + 0x30) == 0) {
      return false;
    }
    uVar5 = llvm::DebugLoc::getLine();
    if (uVar5 != line) {
      return false;
    }
  }
  if (obj->_M_string_length == 0) {
    return true;
  }
  cVar1 = *(obj->_M_dataplus)._M_p;
  objname._M_dataplus._M_p = (pointer)&objname.field_2;
  objname._M_string_length = 0;
  objname.field_2._M_local_buf[0] = '\0';
  if (cVar1 == '&') {
    std::__cxx11::string::substr((ulong)local_50,(ulong)obj);
    std::__cxx11::string::operator=((string *)&objname,(string *)local_50);
    std::__cxx11::string::_M_dispose();
  }
  else {
    std::__cxx11::string::_M_assign((string *)&objname);
  }
  cVar2 = *objname._M_dataplus._M_p;
  if (cVar2 == '@') {
    std::__cxx11::string::substr((ulong)local_50,(ulong)obj);
    std::__cxx11::string::operator=((string *)&objname,(string *)local_50);
    std::__cxx11::string::_M_dispose();
  }
  if (objname._M_string_length < 3) {
LAB_0013aa66:
    if (cVar1 != '&') {
      bVar3 = false;
LAB_0013aa6f:
      bVar4 = instIsCallOf(I,&objname,pta);
      bVar8 = true;
      if (bVar4) goto LAB_0013aaab;
      if (bVar3) goto LAB_0013aaa9;
    }
    bVar3 = usesTheVariable(I,&objname,cVar2 == '@',pta);
    bVar8 = true;
    if (bVar3) goto LAB_0013aaab;
  }
  else {
    iVar6 = std::__cxx11::string::compare((ulong)&objname,objname._M_string_length - 2,(char *)0x2);
    if (iVar6 != 0) goto LAB_0013aa66;
    std::__cxx11::string::substr((ulong)local_50,(ulong)&objname);
    std::__cxx11::string::operator=((string *)&objname,(string *)local_50);
    std::__cxx11::string::_M_dispose();
    bVar3 = true;
    if (cVar1 != '&') goto LAB_0013aa6f;
    if (instMatchesCrit(llvm::Instruction_const&,std::__cxx11::string_const&,unsigned_int,std::__cxx11::string_const&,dg::LLVMPointerAnalysis*)
        ::reported_abi_cxx11_ == '\0') {
      iVar6 = __cxa_guard_acquire(&instMatchesCrit(llvm::Instruction_const&,std::__cxx11::string_const&,unsigned_int,std::__cxx11::string_const&,dg::LLVMPointerAnalysis*)
                                   ::reported_abi_cxx11_);
      if (iVar6 != 0) {
        instMatchesCrit(llvm::Instruction_const&,std::__cxx11::string_const&,unsigned_int,std::__cxx11::string_const&,dg::LLVMPointerAnalysis*)
        ::reported_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        instMatchesCrit(llvm::Instruction_const&,std::__cxx11::string_const&,unsigned_int,std::__cxx11::string_const&,dg::LLVMPointerAnalysis*)
        ::reported_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        instMatchesCrit(llvm::Instruction_const&,std::__cxx11::string_const&,unsigned_int,std::__cxx11::string_const&,dg::LLVMPointerAnalysis*)
        ::reported_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &instMatchesCrit(llvm::Instruction_const&,std::__cxx11::string_const&,unsigned_int,std::__cxx11::string_const&,dg::LLVMPointerAnalysis*)
              ::reported_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
        instMatchesCrit(llvm::Instruction_const&,std::__cxx11::string_const&,unsigned_int,std::__cxx11::string_const&,dg::LLVMPointerAnalysis*)
        ::reported_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             &instMatchesCrit(llvm::Instruction_const&,std::__cxx11::string_const&,unsigned_int,std::__cxx11::string_const&,dg::LLVMPointerAnalysis*)
              ::reported_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
        instMatchesCrit(llvm::Instruction_const&,std::__cxx11::string_const&,unsigned_int,std::__cxx11::string_const&,dg::LLVMPointerAnalysis*)
        ::reported_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        __cxa_atexit(std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::~set,&instMatchesCrit(llvm::Instruction_const&,std::__cxx11::string_const&,unsigned_int,std::__cxx11::string_const&,dg::LLVMPointerAnalysis*)
                             ::reported_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&instMatchesCrit(llvm::Instruction_const&,std::__cxx11::string_const&,unsigned_int,std::__cxx11::string_const&,dg::LLVMPointerAnalysis*)
                             ::reported_abi_cxx11_);
      }
    }
    pVar9 = std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&instMatchesCrit(llvm::Instruction_const&,std::__cxx11::string_const&,unsigned_int,std::__cxx11::string_const&,dg::LLVMPointerAnalysis*)
                           ::reported_abi_cxx11_,obj);
    if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      prVar7 = (raw_ostream *)llvm::errs();
      prVar7 = llvm::raw_ostream::operator<<
                         (prVar7,
                          "ERROR: ignoring invalid criterion (var and func at the same time: ");
      prVar7 = llvm::raw_ostream::operator<<(prVar7,obj);
      llvm::raw_ostream::operator<<(prVar7,"\n");
    }
  }
LAB_0013aaa9:
  bVar8 = false;
LAB_0013aaab:
  std::__cxx11::string::_M_dispose();
  return bVar8;
}

Assistant:

static bool instMatchesCrit(const llvm::Instruction &I, const std::string &fun,
                            unsigned line, const std::string &obj,
                            LLVMPointerAnalysis *pta = nullptr) {
    // function match?
    if (!fun.empty() && I.getParent()->getParent()->getName().str() != fun)
        return false;

    // line match?
    if (line > 0) {
        const auto &Loc = I.getDebugLoc();
#if (LLVM_VERSION_MAJOR == 3 && LLVM_VERSION_MINOR < 7)
        if (Loc.getLine() != line)
#else
        if (!Loc || line != Loc.getLine())
#endif
        {
            return false;
        }
    }

    if (obj.empty()) {
        // we passed the line check and we have no obj to check
        return true;
    }

    // TODO: allow speficy namespaces, not only global/non-global
    bool isvar = obj[0] == '&';
    std::string objname;
    if (isvar) {
        objname = obj.substr(1);
    } else {
        objname = obj;
    }

    bool isglobal = objname[0] == '@';
    if (isglobal) {
        objname = obj.substr(1);
    }

    auto len = objname.length();
    bool isfunc = len > 2 && objname.compare(len - 2, 2, "()") == 0;
    if (isfunc) {
        objname = objname.substr(0, len - 2);
    }

    if (isvar && isfunc) {
        static std::set<std::string> reported;
        if (reported.insert(obj).second) {
            llvm::errs() << "ERROR: ignoring invalid criterion (var and func "
                            "at the same time: "
                         << obj << "\n";
        }
        return false;
    }

    // obj match?
    if (!isvar && instIsCallOf(I, objname, pta)) {
        return true;
    } // else fall through to check the vars

    if (!isfunc && usesTheVariable(I, objname, isglobal, pta)) {
        return true;
    }

    return false;
}